

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O2

int __thiscall Database::createNewSlice(Database *this)

{
  uint __val;
  DatabaseMetadata *pDVar1;
  int __fd;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  
  __val = this->metadata->sliceCount;
  std::operator+(&local_78,&this->file_prefix,".");
  std::__cxx11::to_string(&sStack_98,__val);
  std::operator+(&local_58,&local_78,&sStack_98);
  std::operator+(&filename,&local_58,".data");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  __fd = open(filename._M_dataplus._M_p,0x42,0x1a4);
  if (0 < __fd) {
    ftruncate(__fd,0x2000000);
    pDVar1 = this->metadata;
    pDVar1->currentSliceNumber = __val;
    pDVar1->currentOffset = 0;
    pDVar1->sliceCount = pDVar1->sliceCount + 1;
    std::__cxx11::string::~string((string *)&filename);
    return __fd;
  }
  __assert_fail("data_fd > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                ,0x6f,"int Database::createNewSlice()");
}

Assistant:

int Database::createNewSlice() {
    auto new_slice_id = metadata->sliceCount;
    auto filename = file_prefix + "." + std::to_string(new_slice_id) + ".data";
    int data_fd = open(filename.c_str(), O_RDWR|O_CREAT, 0644);
    assert(data_fd > 0);
    ftruncate(data_fd, SLICE_SIZE);
    metadata->currentSliceNumber = new_slice_id;
    metadata->currentOffset = 0;
    metadata->sliceCount++;
    return data_fd;
}